

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O3

void setmnotwielded(monst *mon,obj *obj)

{
  byte *pbVar1;
  uint uVar2;
  boolean bVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  if (obj == (obj *)0x0) {
    return;
  }
  bVar3 = artifact_light(obj);
  if ((bVar3 == '\0') || ((obj->field_0x4c & 8) == 0)) goto LAB_00284ae1;
  end_burn(obj,'\0');
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00284b60;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00284b5b;
      }
      else {
LAB_00284b5b:
        if (ublindf == (obj *)0x0) goto LAB_00284ae1;
LAB_00284b60:
        if (ublindf->oartifact != '\x1d') goto LAB_00284ae1;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[mon->my][mon->mx] & 1U) == 0))
         || ((mon->data->mflags3 & 0x200) == 0)) goto LAB_00284ae1;
    }
  }
  else {
    bVar3 = worm_known(level,mon);
    if (bVar3 == '\0') goto LAB_00284ae1;
  }
  uVar2 = *(uint *)&mon->field_0x60;
  if ((((uVar2 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar2 & 0x280) != 0) goto LAB_00284ae1;
  }
  else if (((uVar2 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_00284ae1;
  if ((u._1052_1_ & 0x20) == 0) {
    pcVar4 = xname(obj);
    pcVar4 = The(pcVar4);
    pcVar5 = mon_nam(mon);
    pcVar5 = s_suffix(pcVar5);
    pcVar6 = mbodypart(mon,6);
    pcVar7 = otense(obj,"stop");
    pline("%s in %s %s %s glowing.",pcVar4,pcVar5,pcVar6,pcVar7);
  }
LAB_00284ae1:
  pbVar1 = (byte *)((long)&obj->owornmask + 1);
  *pbVar1 = *pbVar1 & 0xfe;
  return;
}

Assistant:

void setmnotwielded(struct monst *mon, struct obj *obj)
{
    if (!obj) return;
    if (artifact_light(obj) && obj->lamplit) {
	end_burn(obj, FALSE);
	if (canseemon(level, mon))
	    pline("%s in %s %s %s glowing.", The(xname(obj)),
		  s_suffix(mon_nam(mon)), mbodypart(mon,HAND),
		  otense(obj, "stop"));
    }
    obj->owornmask &= ~W_WEP;
}